

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

void Abc_NtkReinsertNodes(Abc_Ntk_t *p,Abc_Ntk_t *pNtk,int iPivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  int local_48;
  int local_44;
  int k;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  int iPivot_local;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *p_local;
  
  iVar1 = Abc_NtkIsLogic(p);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x173,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkCiNum(p);
  iVar2 = Abc_NtkCiNum(pNtk);
  if (iVar2 < iVar1) {
    __assert_fail("Abc_NtkCiNum(p) <= Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x174,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  p_00 = Abc_NtkDfs(p,0);
  Abc_NtkCleanCopy(p);
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = Abc_NtkObj(p,local_44);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      Abc_ObjRemoveFanins(pAVar4);
      pcVar7 = Abc_SopRegister((Mem_Flex_t *)p->pManFunc," 0\n");
      (pAVar4->field_5).pData = pcVar7;
    }
  }
  for (local_44 = 0; iVar1 = Abc_NtkCiNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = Abc_NtkCi(p,local_44);
    pAVar6 = Abc_NtkCi(pNtk,local_44);
    (pAVar6->field_6).pCopy = pAVar4;
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Abc_NtkCiNum(p);
  iVar3 = Abc_NtkPoNum(p);
  if (iVar1 + iVar2 + iVar3 == iPivot) {
    for (local_44 = 0; iVar1 = Vec_PtrSize(p_00), local_44 < iVar1; local_44 = local_44 + 1) {
      pvVar5 = Vec_PtrEntry(p_00,local_44);
      iVar1 = Abc_NtkCiNum(p);
      pAVar4 = Abc_NtkObj(pNtk,iVar1 + local_44 + 1);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        (pAVar4->field_6).pTemp = pvVar5;
      }
    }
    local_44 = 0;
    do {
      iVar1 = Vec_PtrSize(p_00);
      if (iVar1 <= local_44) {
        Vec_PtrFree(p_00);
        return;
      }
      pvVar5 = Vec_PtrEntry(p_00,local_44);
      iVar1 = Abc_NtkCiNum(p);
      pAVar4 = Abc_NtkObj(pNtk,iVar1 + local_44 + 1);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        if ((pAVar4->field_6).pTemp != pvVar5) {
          __assert_fail("pNodeNew->pCopy == pNode",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                        ,399,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
        }
        for (local_48 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_48 < iVar1;
            local_48 = local_48 + 1) {
          pAVar6 = Abc_ObjFanin(pAVar4,local_48);
          Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar6->field_6).pCopy);
        }
        pcVar7 = Abc_SopRegister((Mem_Flex_t *)p->pManFunc,(char *)(pAVar4->field_5).pData);
        *(char **)((long)pvVar5 + 0x38) = pcVar7;
      }
      local_44 = local_44 + 1;
    } while( true );
  }
  __assert_fail("Vec_PtrSize(vNodes) + Abc_NtkCiNum(p) + Abc_NtkPoNum(p) == iPivot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                ,0x181,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkReinsertNodes( Abc_Ntk_t * p, Abc_Ntk_t * pNtk, int iPivot )
{
    Abc_Obj_t * pNode, * pNodeNew, * pFaninNew;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( Abc_NtkIsLogic(p) );
    assert( Abc_NtkCiNum(p) <= Abc_NtkCiNum(pNtk) );
    vNodes = Abc_NtkDfs( p, 0 );
    // clean old network
    Abc_NtkCleanCopy( p );
    Abc_NtkForEachNode( p, pNode, i )
    {
        Abc_ObjRemoveFanins( pNode );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pManFunc, (char *)" 0\n" );
    }
    // map CIs
    Abc_NtkForEachCi( p, pNode, i )
        Abc_NtkCi(pNtk, i)->pCopy = pNode;
    // map internal nodes
    assert( Vec_PtrSize(vNodes) + Abc_NtkCiNum(p) + Abc_NtkPoNum(p) == iPivot );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNodeNew = Abc_NtkObj( pNtk, Abc_NtkCiNum(p) + i + 1 );
        if ( pNodeNew == NULL )
            continue;
        pNodeNew->pCopy = pNode;
    }
    // connect internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNodeNew = Abc_NtkObj( pNtk, Abc_NtkCiNum(p) + i + 1 );
        if ( pNodeNew == NULL )
            continue;
        assert( pNodeNew->pCopy == pNode );
        Abc_ObjForEachFanin( pNodeNew, pFaninNew, k )
            Abc_ObjAddFanin( pNodeNew->pCopy, pFaninNew->pCopy );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pManFunc, (char *)pNodeNew->pData );
    }
    Vec_PtrFree( vNodes );
}